

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void pnga_sprs_array_diag_right_multiply(Integer s_a,Integer g_d)

{
  double *pdVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  Integer IVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  int *_ptr;
  Integer iproc;
  void *buf;
  long lVar15;
  int *_buf;
  uint uVar16;
  long lVar17;
  undefined1 (*pauVar18) [16];
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  void *vptr;
  Integer khi;
  Integer klo;
  Integer one;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  Integer local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int local_84;
  Integer local_80;
  Integer local_78;
  Integer local_70;
  long local_68;
  long local_60;
  Integer local_58;
  Integer local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  lVar22 = s_a + 1000;
  lVar15 = g_d + 1000;
  IVar9 = SPA[lVar22].grp;
  local_80 = g_d;
  iproc = pnga_pgroup_nodeid(IVar9);
  local_78 = pnga_pgroup_nnodes(IVar9);
  local_b0 = SPA[lVar22].type;
  local_48 = (ulong)(uint)SPA[lVar22].idx_size;
  local_b8 = 0;
  local_c0 = 0;
  local_c8 = 0;
  local_d0 = 0;
  local_70 = 1;
  bVar25 = _ga_sync_begin != 0;
  local_84 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_a8 = lVar22 * 200;
  if (bVar25) {
    pnga_pgroup_sync(IVar9);
  }
  local_58 = IVar9;
  if (*(long *)((long)&SPA->idim + local_a8) != GA[lVar15].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don\'t match",0);
  }
  if (local_b0 != GA[lVar15].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don\'t match",0);
  }
  if (GA[lVar15].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }
  pnga_sprs_array_row_distribution(s_a,iproc,&local_38,&local_40);
  if (0 < local_78) {
    lVar22 = 0;
    local_b0 = local_b0 + -0x3e9;
    local_50 = s_a;
    do {
      IVar9 = local_50;
      pnga_sprs_array_column_distribution(local_50,lVar22,&local_60,&local_68);
      if ((int)local_48 == 4) {
        pnga_sprs_array_access_col_block(IVar9,lVar22,&local_b8,&local_c0,&local_a0);
        lVar15 = local_60;
        lVar23 = local_68 + 1;
        buf = malloc((lVar23 - local_60) * *(long *)((long)&SPA->size + local_a8));
        local_90 = lVar15 + 1;
        local_98 = lVar23;
        pnga_get(local_80,&local_90,&local_98,buf,&local_70);
        if (local_a0 != 0) {
          switch(local_b0) {
          case 0:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  uVar21 = 0;
                  do {
                    lVar17 = (long)*(int *)(local_b8 + (lVar23 - local_38) * 4) + uVar21;
                    *(int *)(local_a0 + lVar17 * 4) =
                         *(int *)((long)buf + (*(int *)(local_c0 + lVar17 * 4) - lVar15) * 4) *
                         *(int *)(local_a0 + lVar17 * 4);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a0 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(long *)(lVar17 + uVar21 * 8) =
                         *(long *)((long)buf +
                                  (*(int *)(local_c0 + (long)iVar8 * 4 + uVar21 * 4) - lVar15) * 8)
                         * *(long *)(lVar17 + uVar21 * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a0 + (long)iVar8 * 4;
                  uVar21 = 0;
                  do {
                    *(float *)(lVar17 + uVar21 * 4) =
                         *(float *)(lVar17 + uVar21 * 4) *
                         *(float *)((long)buf +
                                   (*(int *)(local_c0 + (long)iVar8 * 4 + uVar21 * 4) - lVar15) * 4)
                    ;
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a0 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(double *)(lVar17 + uVar21 * 8) =
                         *(double *)(lVar17 + uVar21 * 8) *
                         *(double *)
                          ((long)buf +
                          (*(int *)(local_c0 + (long)iVar8 * 4 + uVar21 * 4) - lVar15) * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a0 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    lVar19 = *(int *)(local_c0 + (long)iVar8 * 4 + uVar21 * 4) - lVar15;
                    fVar2 = *(float *)((long)buf + lVar19 * 8);
                    fVar3 = *(float *)((long)buf + lVar19 * 8 + 4);
                    uVar6 = *(undefined8 *)(lVar17 + uVar21 * 8);
                    fVar26 = (float)uVar6;
                    fVar27 = (float)((ulong)uVar6 >> 0x20);
                    *(ulong *)(lVar17 + uVar21 * 8) =
                         CONCAT44(fVar2 * fVar27 + fVar26 * fVar3,fVar2 * fVar26 + fVar27 * -fVar3);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = (long)iVar8 * 0x10 + local_a0;
                  lVar19 = 0;
                  do {
                    lVar24 = (*(int *)(local_c0 + (long)iVar8 * 4 + lVar19) - lVar15) * 0x10;
                    dVar4 = *(double *)((long)buf + lVar24);
                    dVar5 = *(double *)((long)buf + lVar24 + 8);
                    pdVar1 = (double *)(lVar17 + lVar19 * 4);
                    dVar13 = *pdVar1;
                    dVar14 = pdVar1[1];
                    dVar12 = dVar4 * dVar14 + dVar13 * dVar5;
                    auVar10._8_4_ = SUB84(dVar12,0);
                    auVar10._0_8_ = dVar4 * dVar13 + dVar14 * -dVar5;
                    auVar10._12_4_ = (int)((ulong)dVar12 >> 0x20);
                    *(undefined1 (*) [16])(lVar17 + lVar19 * 4) = auVar10;
                    lVar19 = lVar19 + 4;
                  } while ((ulong)uVar16 << 2 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar7 = *(int *)(local_b8 + ((lVar23 + 1) - local_38) * 4);
                iVar8 = *(int *)(local_b8 + (lVar23 - local_38) * 4);
                uVar16 = iVar7 - iVar8;
                if (uVar16 != 0 && iVar8 <= iVar7) {
                  lVar17 = local_a0 + (long)iVar8 * 8;
                  uVar21 = 0;
                  do {
                    *(long *)(lVar17 + uVar21 * 8) =
                         *(long *)((long)buf +
                                  (*(int *)(local_c0 + (long)iVar8 * 4 + uVar21 * 4) - lVar15) * 8)
                         * *(long *)(lVar17 + uVar21 * 8);
                    uVar21 = uVar21 + 1;
                  } while (uVar16 != uVar21);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(IVar9,lVar22,&local_c8,&local_d0,&local_a0);
        lVar15 = local_60;
        lVar23 = local_68 + 1;
        buf = malloc((lVar23 - local_60) * *(long *)((long)&SPA->size + local_a8));
        local_90 = lVar15 + 1;
        local_98 = lVar23;
        pnga_get(local_80,&local_90,&local_98,buf,&local_70);
        if (local_a0 != 0) {
          switch(local_b0) {
          case 0:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  do {
                    *(int *)(local_a0 + lVar19 * 4) =
                         *(int *)((long)buf + (*(long *)(local_d0 + lVar19 * 8) - lVar15) * 4) *
                         *(int *)(local_a0 + lVar19 * 4);
                    lVar19 = lVar19 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 1:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  lVar24 = 0;
                  do {
                    lVar20 = *(long *)(local_c8 + (lVar23 - local_38) * 8) + lVar24;
                    *(long *)(local_a0 + lVar20 * 8) =
                         *(long *)((long)buf + (*(long *)(local_d0 + lVar20 * 8) - lVar15) * 8) *
                         *(long *)(local_a0 + lVar20 * 8);
                    lVar24 = lVar24 + 1;
                  } while (lVar17 - lVar19 != lVar24);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 2:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  do {
                    *(float *)(local_a0 + lVar19 * 4) =
                         *(float *)(local_a0 + lVar19 * 4) *
                         *(float *)((long)buf + (*(long *)(local_d0 + lVar19 * 8) - lVar15) * 4);
                    lVar19 = lVar19 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 3:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  do {
                    *(double *)(local_a0 + lVar19 * 8) =
                         *(double *)(local_a0 + lVar19 * 8) *
                         *(double *)((long)buf + (*(long *)(local_d0 + lVar19 * 8) - lVar15) * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 5:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  do {
                    lVar24 = *(long *)(local_d0 + lVar19 * 8) - lVar15;
                    fVar2 = *(float *)((long)buf + lVar24 * 8);
                    fVar3 = *(float *)((long)buf + lVar24 * 8 + 4);
                    uVar6 = *(undefined8 *)(local_a0 + lVar19 * 8);
                    fVar26 = (float)uVar6;
                    fVar27 = (float)((ulong)uVar6 >> 0x20);
                    *(ulong *)(local_a0 + lVar19 * 8) =
                         CONCAT44(fVar2 * fVar27 + fVar26 * fVar3,fVar2 * fVar26 + fVar27 * -fVar3);
                    lVar19 = lVar19 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 6:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  pauVar18 = (undefined1 (*) [16])(lVar19 * 0x10 + local_a0);
                  do {
                    lVar24 = (*(long *)(local_d0 + lVar19 * 8) - lVar15) * 0x10;
                    dVar4 = *(double *)((long)buf + lVar24);
                    dVar5 = *(double *)((long)buf + lVar24 + 8);
                    dVar12 = dVar4 * *(double *)(*pauVar18 + 8) + *(double *)*pauVar18 * dVar5;
                    auVar11._8_4_ = SUB84(dVar12,0);
                    auVar11._0_8_ =
                         dVar4 * *(double *)*pauVar18 + *(double *)(*pauVar18 + 8) * -dVar5;
                    auVar11._12_4_ = (int)((ulong)dVar12 >> 0x20);
                    *pauVar18 = auVar11;
                    lVar19 = lVar19 + 1;
                    pauVar18 = pauVar18 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
            break;
          case 0xf:
            lVar23 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar17 = *(long *)(local_c8 + ((lVar23 + 1) - local_38) * 8);
                lVar19 = *(long *)(local_c8 + (lVar23 - local_38) * 8);
                if (lVar19 < lVar17) {
                  do {
                    *(long *)(local_a0 + lVar19 * 8) =
                         *(long *)((long)buf + (*(long *)(local_d0 + lVar19 * 8) - lVar15) * 8) *
                         *(long *)(local_a0 + lVar19 * 8);
                    lVar19 = lVar19 + 1;
                  } while (lVar17 != lVar19);
                }
                bVar25 = lVar23 != local_40;
                lVar23 = lVar23 + 1;
              } while (bVar25);
            }
          }
        }
      }
      free(buf);
      lVar22 = lVar22 + 1;
    } while (lVar22 != local_78);
  }
  if (local_84 != 0) {
    pnga_pgroup_sync(local_58);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_right_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_right_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)                  \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        _ptr[_iptr[i-ilo]+j] = _ptr[_iptr[i-ilo]+j]                    \
        * _buf[_jptr[_iptr[i-ilo]+j]-jlo];                             \
      }                                                                \
    }                                                                  \
  }

#define SPRS_COMPLEX_RIGHT_MULTIPLY_M(_type,_iptr,_jptr)               \
  {                                                                    \
    _type *_buf = (_type*)vbuf;                                        \
    _type *_ptr = (_type*)vptr;                                        \
    _type rval, ival, rbuf, ibuf;                                      \
    for (i=ilo; i<=ihi; i++) {                                         \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                             \
      for (j=0; j<ncols; j++) {                                        \
        rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];                    \
        ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];                  \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                               \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                             \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;                \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;              \
      }                                                                \
    }                                                                  \
  }
  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      vbuf = malloc((jhi-jlo+1)*SPA[hdl].size);
      klo = jlo+1;
      khi = jhi+1;
      pnga_get(g_d,&klo,&khi,vbuf,&one);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_RIGHT_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_RIGHT_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
    free(vbuf);
  }

#undef SPRS_REAL_RIGHT_MULTIPLY_M
#undef SPRS_COMPLEX_RIGHT_MULTIPLY_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}